

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestexecutionReportGetString::TestexecutionReportGetString
          (TestexecutionReportGetString *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"executionReportGetString","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x330);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031e410;
  return;
}

Assistant:

TEST(executionReportGetString)
{
  ExecutionReport object;

  object.set( OrderID( "ORDERID" ) );
  object.set( ExecID( "EXECID" ) );
  object.set( ExecTransType( '1' ) );
  object.set( ExecType( '2' ) );
  object.set( OrdStatus( '3' ) );
  object.set( Symbol( "MSFT" ) );
  object.set( Side( '4' ) );
  object.set( LeavesQty( 200 ) );
  object.set( CumQty( 300 ) );
  object.set( AvgPx( 23.4 ) );

  CHECK_EQUAL( "8=FIX.4.2\0019=77\00135=8\0016=23.4\00114=300\001"
               "17=EXECID\00120=1\00137=ORDERID\00139=3\00154=4\00155=MSFT\001"
               "150=2\001151=200\00110=052\001",
               object.toString() );
}